

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_formats.c
# Opt level: O2

FMFieldList copy_field_list(FMFieldList list)

{
  uint uVar1;
  FMFieldList p_Var2;
  ulong uVar3;
  char *pcVar4;
  long lVar5;
  
  uVar1 = count_FMfield(list);
  p_Var2 = (FMFieldList)ffs_malloc((long)(int)(uVar1 + 1) * 0x18);
  lVar5 = 0;
  uVar3 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  for (; uVar3 * 0x18 - lVar5 != 0; lVar5 = lVar5 + 0x18) {
    pcVar4 = strdup(*(char **)((long)&list->field_name + lVar5));
    *(char **)((long)&p_Var2->field_name + lVar5) = pcVar4;
    pcVar4 = strdup(*(char **)((long)&list->field_type + lVar5));
    *(char **)((long)&p_Var2->field_type + lVar5) = pcVar4;
    *(undefined8 *)((long)&p_Var2->field_size + lVar5) =
         *(undefined8 *)((long)&list->field_size + lVar5);
  }
  p_Var2[(int)uVar1].field_name = (char *)0x0;
  p_Var2[(int)uVar1].field_type = (char *)0x0;
  p_Var2[(int)uVar1].field_size = 0;
  p_Var2[(int)uVar1].field_offset = 0;
  return p_Var2;
}

Assistant:

extern
FMFieldList
copy_field_list(FMFieldList list)
{
    int field_count = count_FMfield(list);
    FMFieldList new_field_list;
    int field;

    new_field_list = (FMFieldList) malloc((size_t) sizeof(FMField) *
					     (field_count + 1));
    for (field = 0; field < field_count; field++) {
	new_field_list[field].field_name = strdup(list[field].field_name);
	new_field_list[field].field_type = strdup(list[field].field_type);
	new_field_list[field].field_size = list[field].field_size;
	new_field_list[field].field_offset = list[field].field_offset;
    }
    new_field_list[field_count].field_name = NULL;
    new_field_list[field_count].field_type = NULL;
    new_field_list[field_count].field_offset = 0;
    new_field_list[field_count].field_size = 0;
    return new_field_list;
}